

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O2

void Parser_skipWhiteSpaces(Parser *xmlParser)

{
  void *pvVar1;
  char *pcVar2;
  
  for (pcVar2 = xmlParser->curPtr; *pcVar2 != '\0'; pcVar2 = pcVar2 + 1) {
    pvVar1 = memchr("\n\t\r ",(int)*pcVar2,5);
    if (pvVar1 == (void *)0x0) break;
  }
  xmlParser->curPtr = pcVar2;
  return;
}

Assistant:

static void Parser_skipWhiteSpaces(
	/*! [in] The XML parser. */
	Parser *xmlParser)
{
	char *p = xmlParser->curPtr;
	while (*p && strchr(WHITESPACE, *p)) {
		++p;
	}
	xmlParser->curPtr = p;
}